

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O1

void __thiscall pstore::index::details::linear_node::linear_node(linear_node *this,size_t size)

{
  *(undefined8 *)(this->signature_)._M_elems = 0x72656e4c78646e49;
  this->size_ = size;
  this->leaves_[0].a_ = 0;
  if (size != 0) {
    memset(this->leaves_,0,size << 3);
    return;
  }
  return;
}

Assistant:

linear_node::linear_node (std::size_t const size)
                    : size_{size} {

                static_assert (std::is_standard_layout<linear_node>::value,
                               "linear_node must be standard-layout");
                static_assert (
                    alignof (linear_node) >= 4,
                    "linear_node must have alignment >= 4 to ensure the bottom two bits are 0");

                static_assert (offsetof (linear_node, signature_) == 0,
                               "offsetof (linear_node, signature_) must be 0");
                static_assert (offsetof (linear_node, size_) == 8,
                               "offsetof (linear_node, size_) must be 8");
                static_assert (offsetof (linear_node, leaves_) == 16,
                               "offset of the first child must be 16");

                std::fill_n (&leaves_[0], size, address::null ());
            }